

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  string *psVar1;
  char *pcVar2;
  char *__haystack;
  char *ptrCopy;
  String what;
  char *local_48;
  long local_40;
  undefined8 *local_38;
  
  psVar1 = &this->text;
  ::std::__cxx11::string::append((char *)psVar1);
  kj::operator*(&local_48,exception);
  __haystack = "";
  if (local_40 != 0) {
    __haystack = local_48;
  }
  pcVar2 = strstr(__haystack,"\nstack: ");
  if (pcVar2 == (char *)0x0) {
    ::std::__cxx11::string::append((char *)psVar1);
  }
  else {
    ::std::__cxx11::string::replace
              ((ulong)psVar1,(this->text)._M_string_length,(char *)0x0,(ulong)__haystack);
  }
  ::std::__cxx11::string::push_back((char)psVar1);
  flush(this);
  if (local_48 != (char *)0x0) {
    (**(code **)*local_38)(local_38,local_48,1,local_40,local_40,0,0,0);
  }
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
  }